

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *window)

{
  uint uVar1;
  ImGuiWindow *this;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImRect r_outer;
  ImVec2 ref_pos;
  float local_68;
  float fStack_64;
  ImRect local_48;
  ImRect local_38;
  ImVec2 local_20;
  
  pIVar3 = GImGui;
  uVar1 = window->Flags;
  if ((uVar1 >> 0x1c & 1) == 0) {
    if ((uVar1 >> 0x1a & 1) == 0) {
      if ((uVar1 >> 0x19 & 1) == 0) {
        fVar5 = (window->Pos).x;
        fVar6 = (window->Pos).y;
      }
      else {
        fVar5 = (GImGui->Style).MouseCursorScale;
        IVar2 = NavCalcPreferredRefPos();
        local_20 = IVar2;
        local_48 = GetWindowAllowedExtentRect(window);
        if (((pIVar3->NavDisableHighlight == false) && (pIVar3->NavDisableMouseHover == true)) &&
           (((pIVar3->IO).ConfigFlags & 4) == 0)) {
          fVar5 = 16.0;
          fVar6 = 8.0;
        }
        else {
          fVar5 = fVar5 * 24.0;
          fVar6 = fVar5;
        }
        local_68 = IVar2.x;
        fStack_64 = IVar2.y;
        local_38.Min.y = fStack_64 + -8.0;
        local_38.Min.x = local_68 + -16.0;
        local_38.Max.y = fVar6 + fStack_64;
        local_38.Max.x = fVar5 + local_68;
        IVar2 = FindBestWindowPosForPopupEx
                          (&local_20,&window->Size,&window->AutoPosLastDirection,&local_48,&local_38
                           ,ImGuiPopupPositionPolicy_Default);
        fVar5 = IVar2.x;
        fVar6 = IVar2.y;
        if (window->AutoPosLastDirection == -1) {
          fVar5 = local_68 + 2.0;
          fVar6 = fStack_64 + 2.0;
        }
      }
      goto LAB_0015e0b4;
    }
    local_48 = GetWindowAllowedExtentRect(window);
    fVar5 = (window->Pos).x;
    fVar6 = (window->Pos).y;
    local_38.Min.y = fVar6 + -1.0;
    local_38.Min.x = fVar5 + -1.0;
    local_38.Max.y = fVar6 + 1.0;
    local_38.Max.x = fVar5 + 1.0;
  }
  else {
    this = window->ParentWindow;
    fVar5 = (GImGui->Style).ItemInnerSpacing.x;
    local_48 = GetWindowAllowedExtentRect(window);
    if ((this->DC).MenuBarAppending == true) {
      fVar6 = (this->Pos).y;
      fVar5 = ImGuiWindow::TitleBarHeight(this);
      fVar5 = fVar5 + fVar6;
      fVar6 = (this->Pos).y;
      fVar4 = ImGuiWindow::TitleBarHeight(this);
      local_38.Max.y = ImGuiWindow::MenuBarHeight(this);
      local_38.Max.y = local_38.Max.y + fVar4 + fVar6;
      local_38.Max.x = 3.4028235e+38;
      local_38.Min.x = -3.4028235e+38;
    }
    else {
      fVar6 = (this->Pos).x;
      local_38.Min.x = fVar5 + fVar6;
      local_38.Max.x = ((fVar6 + (this->Size).x) - fVar5) - (this->ScrollbarSizes).x;
      local_38.Max.y = 3.4028235e+38;
      fVar5 = -3.4028235e+38;
    }
    local_38.Min.y = fVar5;
  }
  IVar2 = FindBestWindowPosForPopupEx
                    (&window->Pos,&window->Size,&window->AutoPosLastDirection,&local_48,&local_38,
                     ImGuiPopupPositionPolicy_Default);
  fVar5 = IVar2.x;
  fVar6 = IVar2.y;
LAB_0015e0b4:
  IVar2.y = fVar6;
  IVar2.x = fVar5;
  return IVar2;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
    {
        // Child menus typically request _any_ position within the parent menu item, and then we move the new menu outside the parent bounds.
        // This is how we end up with child menus appearing (most-commonly) on the right of the parent menu.
        ImGuiWindow* parent_window = window->ParentWindow;
        float horizontal_overlap = g.Style.ItemInnerSpacing.x; // We want some overlap to convey the relative depth of each menu (currently the amount of overlap is hard-coded to style.ItemSpacing.x).
        ImRect r_outer = GetWindowAllowedExtentRect(window);
        ImRect r_avoid;
        if (parent_window->DC.MenuBarAppending)
            r_avoid = ImRect(-FLT_MAX, parent_window->Pos.y + parent_window->TitleBarHeight(), FLT_MAX, parent_window->Pos.y + parent_window->TitleBarHeight() + parent_window->MenuBarHeight());
        else
            r_avoid = ImRect(parent_window->Pos.x + horizontal_overlap, -FLT_MAX, parent_window->Pos.x + parent_window->Size.x - horizontal_overlap - parent_window->ScrollbarSizes.x, FLT_MAX);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
    }
    if (window->Flags & ImGuiWindowFlags_Popup)
    {
        ImRect r_outer = GetWindowAllowedExtentRect(window);
        ImRect r_avoid = ImRect(window->Pos.x - 1, window->Pos.y - 1, window->Pos.x + 1, window->Pos.y + 1);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
    }
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Position tooltip (always follows mouse)
        float sc = g.Style.MouseCursorScale;
        ImVec2 ref_pos = NavCalcPreferredRefPos();
        ImRect r_outer = GetWindowAllowedExtentRect(window);
        ImRect r_avoid;
        if (!g.NavDisableHighlight && g.NavDisableMouseHover && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos))
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 16, ref_pos.y + 8);
        else
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 24 * sc, ref_pos.y + 24 * sc); // FIXME: Hard-coded based on mouse cursor shape expectation. Exact dimension not very important.
        ImVec2 pos = FindBestWindowPosForPopupEx(ref_pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
        if (window->AutoPosLastDirection == ImGuiDir_None)
            pos = ref_pos + ImVec2(2, 2); // If there's not enough room, for tooltip we prefer avoiding the cursor at all cost even if it means that part of the tooltip won't be visible.
        return pos;
    }
    IM_ASSERT(0);
    return window->Pos;
}